

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int uv_encode(double u,double v,int em)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double v_00;
  
  v_00 = (double)(~-(ulong)(NAN(u) || NAN(v)) & (ulong)v |
                 -(ulong)(NAN(u) || NAN(v)) & 0x3fde50d794b8199e);
  if (NAN(u) || NAN(v)) {
    u = 0.210526316;
  }
  if (0.016939999535679817 <= v_00) {
    dVar3 = (v_00 + -0.016939999535679817) * 285.7142768952314;
    if (em != 0) {
      iVar1 = rand();
      dVar3 = (double)iVar1 * 4.656612875245797e-10 + dVar3 + -0.5;
    }
    iVar1 = (int)dVar3;
    if (iVar1 < 0xa3) {
      if ((double)uv_row[iVar1].ustart <= u) {
        dVar3 = (u - (double)uv_row[iVar1].ustart) * 285.7142768952314;
        if (em != 0) {
          iVar2 = rand();
          dVar3 = (double)iVar2 * 4.656612875245797e-10 + dVar3 + -0.5;
        }
        if ((int)dVar3 < (int)uv_row[iVar1].nus) {
          return (int)uv_row[iVar1].ncum + (int)dVar3;
        }
      }
    }
  }
  iVar1 = oog_encode(u,v_00);
  return iVar1;
}

Assistant:

int
    uv_encode(double u, double v, int em) /* encode (u',v') coordinates */
{
    register int vi, ui;

    /* check for NaN */
    if (u != u || v != v)
    {
        u = U_NEU;
        v = V_NEU;
    }

    if (v < UV_VSTART)
        return oog_encode(u, v);
    vi = tiff_itrunc((v - UV_VSTART) * (1. / UV_SQSIZ), em);
    if (vi >= UV_NVS)
        return oog_encode(u, v);
    if (u < uv_row[vi].ustart)
        return oog_encode(u, v);
    ui = tiff_itrunc((u - uv_row[vi].ustart) * (1. / UV_SQSIZ), em);
    if (ui >= uv_row[vi].nus)
        return oog_encode(u, v);

    return (uv_row[vi].ncum + ui);
}